

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_system.h
# Opt level: O2

char * strlwr(char *str)

{
  int iVar1;
  char *pcVar2;
  
  for (pcVar2 = str; *pcVar2 != '\0'; pcVar2 = pcVar2 + 1) {
    iVar1 = tolower((int)*pcVar2);
    *pcVar2 = (char)iVar1;
  }
  return str;
}

Assistant:

static inline char *strlwr(char *str)
{
	char *ptr = str;
	while(*ptr)
	{
		*ptr = tolower(*ptr);
		++ptr;
	}
	return str;
}